

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_mt_test.c
# Opt level: O0

int main(int argc,char **argv)

{
  MpiDecTestCmd *cmd;
  MpiDecTestCmd cmd_ctx;
  RK_S32 ret;
  char **argv_local;
  int argc_local;
  
  cmd_ctx.file_slt._4_4_ = 0;
  memset((MpiDecTestCmd *)&cmd,0,0x260);
  cmd_ctx.have_output = 0xffffffff;
  cmd_ctx.file_slt._4_4_ = mpi_dec_test_cmd_init((MpiDecTestCmd *)&cmd,argc,argv);
  if (cmd_ctx.file_slt._4_4_ == 0) {
    mpi_dec_test_cmd_options((MpiDecTestCmd *)&cmd);
    if (cmd_ctx.file_output._248_4_ == 8) {
      _mpp_log_l(4,"mpi_dec_mt_test","mpi_dec_mt_test not support mjpeg yet\n",0);
    }
    else {
      cmd_ctx.file_slt._4_4_ = mt_dec_decode((MpiDecTestCmd *)&cmd);
      if (cmd_ctx.file_slt._4_4_ == 0) {
        _mpp_log_l(4,"mpi_dec_mt_test","test success\n",0);
      }
      else {
        _mpp_log_l(2,"mpi_dec_mt_test","test failed ret %d\n",0,cmd_ctx.file_slt._4_4_);
      }
    }
  }
  mpi_dec_test_cmd_deinit((MpiDecTestCmd *)&cmd);
  return cmd_ctx.file_slt._4_4_;
}

Assistant:

int main(int argc, char **argv)
{
    RK_S32 ret = 0;
    MpiDecTestCmd  cmd_ctx;
    MpiDecTestCmd* cmd = &cmd_ctx;

    memset((void*)cmd, 0, sizeof(*cmd));
    // default use block mode
    cmd->timeout = -1;

    // parse the cmd option
    ret = mpi_dec_test_cmd_init(cmd, argc, argv);
    if (ret)
        goto RET;

    mpi_dec_test_cmd_options(cmd);

    if (cmd->type == MPP_VIDEO_CodingMJPEG) {
        mpp_log("mpi_dec_mt_test not support mjpeg yet\n");
        goto RET;
    }

    ret = mt_dec_decode(cmd);
    if (MPP_OK == ret)
        mpp_log("test success\n");
    else
        mpp_err("test failed ret %d\n", ret);

RET:
    mpi_dec_test_cmd_deinit(cmd);

    return ret;
}